

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O1

void TestShiftLeft(void)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector<const_char> value;
  Vector<const_char> value_00;
  Vector<const_char> value_01;
  Vector<const_char> value_02;
  Vector<const_char> value_03;
  Vector<const_char> value_04;
  char buffer [1024];
  Bignum bignum;
  char local_618;
  char cStack_617;
  char cStack_616;
  char cStack_615;
  char cStack_614;
  char cStack_613;
  char cStack_612;
  char cStack_611;
  undefined2 uStack_610;
  char cStack_60e;
  char cStack_60d;
  char cStack_60c;
  char cStack_60b;
  char cStack_60a;
  char cStack_609;
  char local_608;
  char cStack_607;
  char cStack_606;
  char cStack_605;
  char cStack_604;
  char cStack_603;
  char cStack_602;
  char cStack_601;
  char cStack_600;
  char cStack_5ff;
  char cStack_5fe;
  char cStack_5fd;
  char cStack_5fc;
  char cStack_5fb;
  char cStack_5fa;
  char cStack_5f9;
  Bignum local_214;
  
  local_214.used_bigits_ = 0;
  local_214.exponent_ = 0;
  value._8_8_ = 1;
  value.start_ = "0";
  double_conversion::Bignum::AssignHexString(&local_214,value);
  double_conversion::Bignum::ShiftLeft(&local_214,100);
  bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
  if (!bVar1) {
    uVar3 = 0x7d;
LAB_0081e050:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar3,"bignum.ToHexString(buffer, kBufferSize)");
    abort();
  }
  if (CONCAT11(cStack_617,local_618) == 0x30) {
    value_00._8_8_ = 1;
    value_00.start_ = "1";
    double_conversion::Bignum::AssignHexString(&local_214,value_00);
    double_conversion::Bignum::ShiftLeft(&local_214,1);
    bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
    if (!bVar1) {
      uVar3 = 0x82;
      goto LAB_0081e050;
    }
    if (CONCAT11(cStack_617,local_618) == 0x32) {
      value_01._8_8_ = 1;
      value_01.start_ = "1";
      double_conversion::Bignum::AssignHexString(&local_214,value_01);
      double_conversion::Bignum::ShiftLeft(&local_214,4);
      bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
      if (!bVar1) {
        uVar3 = 0x87;
        goto LAB_0081e050;
      }
      if (cStack_616 == '\0' && CONCAT11(cStack_617,local_618) == 0x3031) {
        value_02._8_8_ = 1;
        value_02.start_ = "1";
        double_conversion::Bignum::AssignHexString(&local_214,value_02);
        double_conversion::Bignum::ShiftLeft(&local_214,0x20);
        bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
        if (!bVar1) {
          uVar3 = 0x8c;
          goto LAB_0081e050;
        }
        if (uStack_610 == 0x30 &&
            CONCAT17(cStack_611,
                     CONCAT16(cStack_612,
                              CONCAT15(cStack_613,
                                       CONCAT14(cStack_614,
                                                CONCAT13(cStack_615,
                                                         CONCAT12(cStack_616,
                                                                  CONCAT11(cStack_617,local_618)))))
                             )) == 0x3030303030303031) {
          value_03._8_8_ = 1;
          value_03.start_ = "1";
          double_conversion::Bignum::AssignHexString(&local_214,value_03);
          double_conversion::Bignum::ShiftLeft(&local_214,0x40);
          bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
          if (!bVar1) {
            uVar3 = 0x91;
            goto LAB_0081e050;
          }
          auVar5[0] = -(local_618 == '1');
          auVar5[1] = -(cStack_617 == '0');
          auVar5[2] = -(cStack_616 == '0');
          auVar5[3] = -(cStack_615 == '0');
          auVar5[4] = -(cStack_614 == '0');
          auVar5[5] = -(cStack_613 == '0');
          auVar5[6] = -(cStack_612 == '0');
          auVar5[7] = -(cStack_611 == '0');
          auVar5[8] = -((char)uStack_610 == '0');
          auVar5[9] = -(uStack_610._1_1_ == '0');
          auVar5[10] = -(cStack_60e == '0');
          auVar5[0xb] = -(cStack_60d == '0');
          auVar5[0xc] = -(cStack_60c == '0');
          auVar5[0xd] = -(cStack_60b == '0');
          auVar5[0xe] = -(cStack_60a == '0');
          auVar5[0xf] = -(cStack_609 == '0');
          auVar8[0] = -((char)_local_608 == '0');
          auVar8[1] = -((char)((ushort)_local_608 >> 8) == '\0');
          auVar8[2] = 0xff;
          auVar8[3] = 0xff;
          auVar8[4] = 0xff;
          auVar8[5] = 0xff;
          auVar8[6] = 0xff;
          auVar8[7] = 0xff;
          auVar8[8] = 0xff;
          auVar8[9] = 0xff;
          auVar8[10] = 0xff;
          auVar8[0xb] = 0xff;
          auVar8[0xc] = 0xff;
          auVar8[0xd] = 0xff;
          auVar8[0xe] = 0xff;
          auVar8[0xf] = 0xff;
          auVar8 = auVar8 & auVar5;
          if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
            value_04._8_8_ = 0xf;
            value_04.start_ = "123456789ABCDEF";
            double_conversion::Bignum::AssignHexString(&local_214,value_04);
            double_conversion::Bignum::ShiftLeft(&local_214,0x40);
            bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
            if (!bVar1) {
              uVar3 = 0x96;
              goto LAB_0081e050;
            }
            auVar9[0] = -(local_608 == '0');
            auVar9[1] = -(cStack_607 == '0');
            auVar9[2] = -(cStack_606 == '0');
            auVar9[3] = -(cStack_605 == '0');
            auVar9[4] = -(cStack_604 == '0');
            auVar9[5] = -(cStack_603 == '0');
            auVar9[6] = -(cStack_602 == '0');
            auVar9[7] = -(cStack_601 == '0');
            auVar9[8] = -(cStack_600 == '0');
            auVar9[9] = -(cStack_5ff == '0');
            auVar9[10] = -(cStack_5fe == '0');
            auVar9[0xb] = -(cStack_5fd == '0');
            auVar9[0xc] = -(cStack_5fc == '0');
            auVar9[0xd] = -(cStack_5fb == '0');
            auVar9[0xe] = -(cStack_5fa == '0');
            auVar9[0xf] = -(cStack_5f9 == '\0');
            auVar6[0] = -(local_618 == '1');
            auVar6[1] = -(cStack_617 == '2');
            auVar6[2] = -(cStack_616 == '3');
            auVar6[3] = -(cStack_615 == '4');
            auVar6[4] = -(cStack_614 == '5');
            auVar6[5] = -(cStack_613 == '6');
            auVar6[6] = -(cStack_612 == '7');
            auVar6[7] = -(cStack_611 == '8');
            auVar6[8] = -((char)uStack_610 == '9');
            auVar6[9] = -(uStack_610._1_1_ == 'A');
            auVar6[10] = -(cStack_60e == 'B');
            auVar6[0xb] = -(cStack_60d == 'C');
            auVar6[0xc] = -(cStack_60c == 'D');
            auVar6[0xd] = -(cStack_60b == 'E');
            auVar6[0xe] = -(cStack_60a == 'F');
            auVar6[0xf] = -(cStack_609 == '0');
            auVar6 = auVar6 & auVar9;
            if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
              double_conversion::Bignum::ShiftLeft(&local_214,1);
              bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
              if (!bVar1) {
                uVar3 = 0x99;
                goto LAB_0081e050;
              }
              auVar10[0] = -(local_608 == '0');
              auVar10[1] = -(cStack_607 == '0');
              auVar10[2] = -(cStack_606 == '0');
              auVar10[3] = -(cStack_605 == '0');
              auVar10[4] = -(cStack_604 == '0');
              auVar10[5] = -(cStack_603 == '0');
              auVar10[6] = -(cStack_602 == '0');
              auVar10[7] = -(cStack_601 == '0');
              auVar10[8] = -(cStack_600 == '0');
              auVar10[9] = -(cStack_5ff == '0');
              auVar10[10] = -(cStack_5fe == '0');
              auVar10[0xb] = -(cStack_5fd == '0');
              auVar10[0xc] = -(cStack_5fc == '0');
              auVar10[0xd] = -(cStack_5fb == '0');
              auVar10[0xe] = -(cStack_5fa == '0');
              auVar10[0xf] = -(cStack_5f9 == '\0');
              auVar7[0] = -(local_618 == '2');
              auVar7[1] = -(cStack_617 == '4');
              auVar7[2] = -(cStack_616 == '6');
              auVar7[3] = -(cStack_615 == '8');
              auVar7[4] = -(cStack_614 == 'A');
              auVar7[5] = -(cStack_613 == 'C');
              auVar7[6] = -(cStack_612 == 'F');
              auVar7[7] = -(cStack_611 == '1');
              auVar7[8] = -((char)uStack_610 == '3');
              auVar7[9] = -(uStack_610._1_1_ == '5');
              auVar7[10] = -(cStack_60e == '7');
              auVar7[0xb] = -(cStack_60d == '9');
              auVar7[0xc] = -(cStack_60c == 'B');
              auVar7[0xd] = -(cStack_60b == 'D');
              auVar7[0xe] = -(cStack_60a == 'E');
              auVar7[0xf] = -(cStack_609 == '0');
              auVar7 = auVar7 & auVar10;
              if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
                return;
              }
              pcVar2 = "\"2468ACF13579BDE0000000000000000\"";
              pcVar4 = "2468ACF13579BDE0000000000000000";
              uVar3 = 0x9a;
            }
            else {
              pcVar2 = "\"123456789ABCDEF0000000000000000\"";
              pcVar4 = "123456789ABCDEF0000000000000000";
              uVar3 = 0x97;
            }
          }
          else {
            pcVar2 = "\"10000000000000000\"";
            pcVar4 = "10000000000000000";
            uVar3 = 0x92;
          }
        }
        else {
          pcVar2 = "\"100000000\"";
          pcVar4 = "100000000";
          uVar3 = 0x8d;
        }
      }
      else {
        pcVar2 = "\"10\"";
        pcVar4 = "10";
        uVar3 = 0x88;
      }
    }
    else {
      pcVar2 = "\"2\"";
      pcVar4 = "2";
      uVar3 = 0x83;
    }
  }
  else {
    pcVar2 = "\"0\"";
    pcVar4 = "0";
    uVar3 = 0x7e;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar3,pcVar2,"buffer",pcVar4,&local_618);
  abort();
}

Assistant:

TEST(ShiftLeft) {
  char buffer[kBufferSize];
  Bignum bignum;
  AssignHexString(&bignum, "0");
  bignum.ShiftLeft(100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(4);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(32);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(64);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000", buffer);

  AssignHexString(&bignum, "123456789ABCDEF");
  bignum.ShiftLeft(64);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0000000000000000", buffer);
  bignum.ShiftLeft(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2468ACF13579BDE0000000000000000", buffer);
}